

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

int __thiscall
vkt::shaderexecutor::DefaultSampling<int>::genRandom
          (DefaultSampling<int> *this,FloatFormat *param_1,Precision prec,Random *rnd)

{
  deUint32 dVar1;
  deBool dVar2;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 0xffffffff;
  if (prec < PRECISION_LAST) {
    uVar5 = *(uint *)(&DAT_00b5cef8 + (ulong)prec * 4);
  }
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  dVar2 = deRandom_getBool(&rnd->m_rnd);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  uVar4 = dVar3 % ((1 << ((byte)(dVar1 % uVar5) & 0x1f)) + 1U);
  uVar5 = -uVar4;
  if (dVar2 != 1) {
    uVar5 = uVar4;
  }
  return uVar5;
}

Assistant:

int		genRandom	(const FloatFormat&, Precision prec, Random& rnd) const
	{
		const int	exp		= rnd.getInt(0, getNumBits(prec)-2);
		const int	sign	= rnd.getBool() ? -1 : 1;

		return sign * rnd.getInt(0, (deInt32)1 << exp);
	}